

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int wally_psbt_remove_input(wally_psbt *psbt,uint32_t index)

{
  int local_18;
  int ret;
  uint32_t index_local;
  wally_psbt *psbt_local;
  
  if (((psbt == (wally_psbt *)0x0) || (psbt->tx == (wally_tx *)0x0)) ||
     (psbt->tx->num_inputs != psbt->num_inputs)) {
    local_18 = -2;
  }
  else {
    local_18 = wally_tx_remove_input(psbt->tx,(ulong)index);
  }
  if (local_18 == 0) {
    psbt_input_free(psbt->inputs + index,false);
    memmove(psbt->inputs + index,psbt->inputs + (ulong)index + 1,
            ((psbt->num_inputs - (ulong)index) + -1) * 0x110);
    psbt->num_inputs = psbt->num_inputs - 1;
  }
  return local_18;
}

Assistant:

int wally_psbt_remove_input(struct wally_psbt *psbt, uint32_t index)
{
    int ret;

    if (!psbt || !psbt->tx || psbt->tx->num_inputs != psbt->num_inputs)
        ret = WALLY_EINVAL;
    else
        ret = wally_tx_remove_input(psbt->tx, index);
    if (ret == WALLY_OK) {
        psbt_input_free(&psbt->inputs[index], false);
        memmove(psbt->inputs + index, psbt->inputs + index + 1,
                (psbt->num_inputs - index - 1) * sizeof(struct wally_psbt_input));
        psbt->num_inputs -= 1;
    }
    return ret;
}